

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<int,char>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  int iVar2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  int local_28;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_24;
  
  su.m_int = '\0';
  local_24.m_int = 0;
  SafeInt::operator_cast_to_char((SafeInt *)&local_24);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\0');
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            (&local_24,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x0);
  operator*('\0',local_24);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\0');
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,
             (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x0);
  iVar2 = 1;
  local_28 = iVar2;
  local_24.m_int = iVar2;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &su,&local_28);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            (&local_24,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x1);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,su);
  local_24.m_int = iVar2;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            (&local_24,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x1);
  operator/('\x01',local_24);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,su);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            (&local_24,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x1);
  operator+('\x01',local_24);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,su);
  local_24.m_int = 0;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\0');
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            (&local_24,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x0);
  operator-('\0',local_24);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\0');
  local_28 = iVar2;
  local_24.m_int = iVar2;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &su,&local_28);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,su);
  local_28 = iVar2;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &su,&local_28);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SVar1 = SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator<<((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_24,su);
  operator<<(SVar1.m_int,su);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,su);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SVar1 = SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator>>((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_24,su);
  operator>>(SVar1.m_int,su);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,'\x01');
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_24,su);
  BinaryAndHelper<int,_char,_1>::And(local_24.m_int,'\x01');
  local_24.m_int = 0;
  local_24.m_int = BinaryAndHelper<int,_char,_1>::And(0,'\x01');
  local_24.m_int = BinaryAndHelper<int,_char,_1>::And(local_24.m_int,su.m_int);
  BinaryOrHelper<int,_char,_1>::Or(local_24.m_int,'\x01');
  local_24.m_int = BinaryOrHelper<int,_char,_1>::Or(local_24.m_int,'\x01');
  local_24.m_int = BinaryOrHelper<int,_char,_1>::Or(local_24.m_int,su.m_int);
  BinaryXorHelper<int,_char,_1>::Xor(local_24.m_int,'\x01');
  local_24.m_int = BinaryXorHelper<int,_char,_1>::Xor(local_24.m_int,'\x01');
  BinaryXorHelper<int,_char,_1>::Xor(local_24.m_int,su.m_int);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}